

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_args.c
# Opt level: O3

int mpt_config_args(mpt_config *cfg,mpt_iterator *args,mpt_logger *info)

{
  mpt_type_t type;
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  mpt_value *pmVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  mpt_property pr;
  mpt_path p;
  void *ptr;
  char *local_88;
  undefined8 uStack_80;
  mpt_value local_78;
  char *local_68;
  undefined8 uStack_60;
  mpt_path local_58;
  long *local_38;
  
  local_58.len = 0;
  local_58.first = '\0';
  local_58.flags = '\0';
  local_58.sep = '.';
  local_58.assign = '\0';
  local_58._28_4_ = 0;
  local_58.base._0_4_ = 0;
  local_58.base._4_4_ = 0;
  local_58.off._0_4_ = 0;
  local_58.off._4_4_ = 0;
  if (args == (mpt_iterator *)0x0) {
    uVar3 = (*cfg->_vptr->assign)(cfg,&local_58,(mpt_value *)0x0);
    uVar6 = 0;
    if (((int)uVar3 < 0) && (uVar6 = uVar3, info != (mpt_logger *)0x0)) {
      mpt_log(info,"mpt_config_args",3,"%s","unable to set default config");
    }
  }
  else {
    uVar6 = 0;
    do {
      local_68 = (char *)0x0;
      uStack_60 = 0;
      local_78._addr = (char **)0x0;
      local_78._type = 0;
      local_88 = (char *)0x0;
      uStack_80 = 0;
      pmVar4 = (*args->_vptr->value)(args);
      if ((pmVar4 == (mpt_value *)0x0) ||
         (local_38 = (long *)pmVar4->_addr, local_38 == (long *)0x0)) {
        if (info != (mpt_logger *)0x0) {
          pcVar7 = "unable to set default config";
          goto LAB_0010ba38;
        }
      }
      else {
        type = pmVar4->_type;
        if (((type == 0x80) || (type == 0x801)) || (type - 0x100 < 0x700)) {
          puVar1 = (undefined8 *)*local_38;
          if (puVar1 == (undefined8 *)0x0) {
            if (info != (mpt_logger *)0x0) {
              pcVar7 = "missing convertable pointer";
              goto LAB_0010ba38;
            }
          }
          else {
            iVar2 = (**(code **)*puVar1)(puVar1,0x1a,&local_88);
            if ((iVar2 < 0) || (local_78._type == 0)) {
              iVar2 = (**(code **)*puVar1)(puVar1,0x73,&local_88);
              if (iVar2 < 0) {
                if (info != (mpt_logger *)0x0) {
                  pcVar7 = "invalid assinment";
LAB_0010ba38:
                  mpt_log(info,"mpt_config_args",3,"%s",pcVar7);
                }
              }
              else {
                if (local_88 != (char *)0x0) goto LAB_0010bae2;
                if (info != (mpt_logger *)0x0) {
                  pcVar7 = "invalid property name";
                  goto LAB_0010ba38;
                }
              }
            }
            else {
              local_58.assign = '\0';
              mpt_path_set(&local_58,local_88,-1);
LAB_0010bae2:
              pcVar7 = local_88;
              if (local_78._type == 0) {
                pcVar5 = strchr(local_88,0x3d);
                if (pcVar5 == (char *)0x0) {
                  if (info != (mpt_logger *)0x0) {
                    mpt_log(info,"mpt_config_args",4,"%s: %s","missing path separator",pcVar7);
                  }
                  goto LAB_0010ba3f;
                }
                local_58.assign = '=';
                mpt_path_set(&local_58,pcVar7,(int)pcVar5 - (int)pcVar7);
                local_78._type = 0x73;
                local_68 = pcVar5 + 1;
                local_78._addr = &local_68;
              }
              if (local_88 == (char *)0x0) {
                if (info != (mpt_logger *)0x0) {
                  uVar6 = uVar6 + 1;
                  mpt_log(info,"mpt_config_args",4,"%s: %d","missing config path",(ulong)uVar6);
                }
                iVar2 = -3;
LAB_0010bd0b:
                if (uVar6 == 0) {
                  return iVar2;
                }
                return uVar6;
              }
              iVar2 = (*cfg->_vptr->assign)(cfg,&local_58,&local_78);
              if (iVar2 < 0) {
                if (info == (mpt_logger *)0x0) {
                  iVar2 = -2;
                  goto LAB_0010bd0b;
                }
                pcVar7 = (char *)pmVar4->_type;
                uVar6 = uVar6 + 1;
                iVar2 = 3;
                pcVar5 = "%s (%d): %d";
                pcVar8 = "config assign error";
              }
              else {
                if (info == (mpt_logger *)0x0) {
                  uVar6 = uVar6 + 1;
                  goto LAB_0010ba3f;
                }
                iVar2 = 0x14;
                pcVar5 = "%s: %s";
                pcVar8 = "element assiged";
                pcVar7 = local_88;
              }
              mpt_log(info,"mpt_config_args",iVar2,pcVar5,pcVar8,pcVar7);
            }
          }
        }
        else {
          local_88 = mpt_data_tostring(&local_38,type,(size_t *)0x0);
          if (local_88 != (char *)0x0) goto LAB_0010bae2;
          if (info != (mpt_logger *)0x0) {
            uVar6 = uVar6 + 1;
            mpt_log(info,"mpt_config_args",4,"%s: %d (%d)","bad string value",(ulong)uVar6,
                    pmVar4->_type);
          }
        }
      }
LAB_0010ba3f:
      iVar2 = (*args->_vptr->advance)(args);
    } while (0 < iVar2);
    if (iVar2 == 0) {
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

extern int mpt_config_args(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(iterator) *args, MPT_INTERFACE(logger) *info)
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	
	int res, count, err;
	
	if (!args) {
		res = cfg->_vptr->assign(cfg, &p, 0);
		if (res < 0) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			return res;
		}
		return 0;
	}
	err = 0;
	count = 0;
	do {
		MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
		const MPT_STRUCT(value) *val = args->_vptr->value(args);
		const void *ptr;
		const char *end;
		
		if (!val || !(ptr = val->_addr)) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			continue;
		}
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv;
			
			if (!(conv = *((void * const *) ptr))) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("missing convertable pointer"));
				}
				continue;
			}
			/* get assign target */
			else if ((res = conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr)) >= 0 && pr.val._type) {
				p.assign = 0;
				mpt_path_set(&p, pr.name, -1);
			}
			else if ((res = conv->_vptr->convert(conv, 's', &pr.name)) < 0) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid assinment"));
				}
				continue;
			}
			else if (!pr.name) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid property name"));
				}
				continue;
			}
		}
		else if (!(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d (%d)",
				        MPT_tr("bad string value"), ++count, val->_type);
			}
			continue;
		}
		/* no property type assigned */
		if (!pr.val._type) {
			if (!(end = strchr(pr.name, '='))) {
				++err;
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Warning), "%s: %s",
					        MPT_tr("missing path separator"), pr.name);
				}
				continue;
			}
			p.assign = '=';
			mpt_path_set(&p, pr.name, end - pr.name);
			MPT_property_set_string(&pr, end + 1);
		}
		/* no top level assign */
		if (!pr.name) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d",
				        MPT_tr("missing config path"), ++count);
			}
			return count ? count : MPT_ERROR(BadType);
		}
		/* assign config */
		if (cfg->_vptr->assign(cfg, &p, &pr.val) < 0) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s (%d): %d",
				        MPT_tr("config assign error"), val->_type, ++count);
				continue;
			}
			return count ? count : MPT_ERROR(BadValue);
		}
		if (info) {
			mpt_log(info, __func__, MPT_LOG(Debug2), "%s: %s",
			        MPT_tr("element assiged"), pr.name);
			continue;
		}
		++count;
	} while ((res = args->_vptr->advance(args)) > 0);
	
	return res ? count : 0;
}